

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SurfaceBase.h
# Opt level: O0

void anurbs::SurfaceBase<2L>::register_python(module *m)

{
  char *name_00;
  class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>> *pcVar1;
  class_<anurbs::SurfaceBase<2L>,_std::shared_ptr<anurbs::SurfaceBase<2L>_>_> *pcVar2;
  arg aVar3;
  undefined1 local_178;
  arg local_170;
  arg local_160;
  arg local_150;
  arg local_140;
  arg local_130;
  offset_in_Model_to_subr local_120 [2];
  arg local_110;
  arg local_100;
  arg local_f0;
  arg local_e0;
  offset_in_Model_to_subr local_d0 [10];
  anon_class_1_0_00000001 local_79;
  offset_in_Model_to_subr local_78 [6];
  handle local_48;
  class_<anurbs::SurfaceBase<2L>,_std::shared_ptr<anurbs::SurfaceBase<2L>_>_> local_40;
  class_<anurbs::SurfaceBase<2L>,_std::shared_ptr<anurbs::SurfaceBase<2L>_>_> local_38;
  class_<anurbs::SurfaceBase<2L>,_std::shared_ptr<anurbs::SurfaceBase<2L>_>_> py_class;
  string name;
  module *m_local;
  
  SurfaceBase<2l>::python_name_abi_cxx11_();
  local_48.m_ptr = (m->super_object).super_handle.m_ptr;
  name_00 = (char *)std::__cxx11::string::c_str();
  pybind11::class_<anurbs::SurfaceBase<2L>,_std::shared_ptr<anurbs::SurfaceBase<2L>_>_>::class_<>
            (&local_40,local_48,name_00);
  local_78[3] = 0;
  local_78[2] = 0x11;
  pcVar1 = (class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>> *)
           pybind11::class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>>::
           def_property_readonly<long(anurbs::SurfaceBase<2l>::*)()const>
                     ((class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>> *)
                      &local_40,"degree_u",local_78 + 2);
  local_78[1] = 0;
  local_78[0] = 0x19;
  pcVar1 = (class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>> *)
           pybind11::class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>>::
           def_property_readonly<long(anurbs::SurfaceBase<2l>::*)()const>
                     (pcVar1,"degree_v",local_78);
  pcVar1 = (class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>> *)
           pybind11::class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>>::
           def_property_readonly<anurbs::SurfaceBase<2l>::register_python(pybind11::module&)::_lambda(anurbs::SurfaceBase<2l>&)_1_>
                     (pcVar1,"dimension",&local_79);
  local_d0[9] = 0;
  local_d0[8] = 0x21;
  pcVar1 = (class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>> *)
           pybind11::class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>>::
           def_property_readonly<anurbs::Interval(anurbs::SurfaceBase<2l>::*)()const>
                     (pcVar1,"domain_u",local_d0 + 8);
  local_d0[7] = 0;
  local_d0[6] = 0x29;
  pcVar1 = (class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>> *)
           pybind11::class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>>::
           def_property_readonly<anurbs::Interval(anurbs::SurfaceBase<2l>::*)()const>
                     (pcVar1,"domain_v",local_d0 + 6);
  local_d0[5] = 0;
  local_d0[4] = 0x41;
  pcVar1 = (class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>> *)
           pybind11::class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>>::
           def_property_readonly<std::vector<anurbs::Interval,std::allocator<anurbs::Interval>>(anurbs::SurfaceBase<2l>::*)()const>
                     (pcVar1,"spans_u",local_d0 + 4);
  local_d0[3] = 0;
  local_d0[2] = 0x49;
  pcVar1 = (class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>> *)
           pybind11::class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>>::
           def_property_readonly<std::vector<anurbs::Interval,std::allocator<anurbs::Interval>>(anurbs::SurfaceBase<2l>::*)()const>
                     (pcVar1,"spans_v",local_d0 + 2);
  local_d0[1] = 0;
  local_d0[0] = 0x31;
  local_f0 = pybind11::literals::operator____a("u",1);
  local_e0.name = local_f0.name;
  local_e0._8_1_ = local_f0._8_1_;
  local_110 = pybind11::literals::operator____a("v",1);
  local_100.name = local_110.name;
  local_100._8_1_ = local_110._8_1_;
  pcVar1 = (class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>> *)
           pybind11::class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>>::
           def<Eigen::Matrix<double,1,2,1,1,2>(anurbs::SurfaceBase<2l>::*)(double,double)const,pybind11::arg,pybind11::arg>
                     (pcVar1,"point_at",local_d0,&local_e0,&local_100);
  local_120[1] = 0;
  local_120[0] = 0x39;
  local_140 = pybind11::literals::operator____a("u",1);
  local_130.name = local_140.name;
  local_130._8_1_ = local_140._8_1_;
  local_160 = pybind11::literals::operator____a("v",1);
  local_150.name = local_160.name;
  local_150._8_1_ = local_160._8_1_;
  aVar3 = pybind11::literals::operator____a("order",5);
  local_170.name = aVar3.name;
  local_178 = aVar3._8_1_;
  local_170._8_1_ = local_178;
  pcVar2 = pybind11::class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>>::
           def<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>(anurbs::SurfaceBase<2l>::*)(double,double,long)const,pybind11::arg,pybind11::arg,pybind11::arg>
                     (pcVar1,"derivatives_at",local_120,&local_130,&local_150,&local_170);
  pybind11::class_<anurbs::SurfaceBase<2L>,_std::shared_ptr<anurbs::SurfaceBase<2L>_>_>::class_
            (&local_38,pcVar2);
  pybind11::class_<anurbs::SurfaceBase<2L>,_std::shared_ptr<anurbs::SurfaceBase<2L>_>_>::~class_
            (&local_40);
  pybind11::class_<anurbs::SurfaceBase<2L>,_std::shared_ptr<anurbs::SurfaceBase<2L>_>_>::~class_
            (&local_38);
  std::__cxx11::string::~string((string *)&py_class);
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = SurfaceBase<TDimension>;
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        auto py_class = py::class_<Type, Holder>(m, name.c_str())
            // read-only property
            .def_property_readonly("degree_u", &Type::degree_u)
            .def_property_readonly("degree_v", &Type::degree_v)
            .def_property_readonly("dimension", [](Type&) {
                return Type::dimension(); })
            .def_property_readonly("domain_u", &Type::domain_u)
            .def_property_readonly("domain_v", &Type::domain_v)
            .def_property_readonly("spans_u", &Type::spans_u)
            .def_property_readonly("spans_v", &Type::spans_v)
            // methods
            .def("point_at", &Type::point_at, "u"_a, "v"_a)
            .def("derivatives_at", &Type::derivatives_at, "u"_a, "v"_a,
                "order"_a)
        ;

        if constexpr(dimension() == 3) {
            py_class.def("normal_at", &Type::normal_at, "u"_a, "v"_a);
        }
    }